

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::AvgState<duckdb::hugeint_t>,duckdb::dtime_tz_t,duckdb::TimeTZAverageOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  long lVar1;
  ulong uVar2;
  FunctionData *pFVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  UnifiedVectorFormat idata;
  AggregateUnaryInput local_90;
  undefined1 local_78 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (*input == (Vector)0x0) {
    lVar8 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    local_78._16_8_ = 0;
    if (0x3f < count + 0x3f) {
      uVar12 = 0;
      uVar11 = 0;
      uVar10 = 0;
      local_78._0_8_ = aggr_input_data;
      local_78._8_8_ = input + 0x28;
      do {
        lVar1 = *(long *)(input + 0x28);
        if (lVar1 == 0) {
          uVar13 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar13 = count;
          }
joined_r0x003fc768:
          while (uVar9 = uVar12, uVar5 = uVar12, uVar6 = local_78._16_8_, uVar12 < uVar13) {
            TimeTZAverageOperation::
            Operation<duckdb::dtime_tz_t,duckdb::AvgState<duckdb::hugeint_t>,duckdb::TimeTZAverageOperation>
                      ((AvgState<duckdb::hugeint_t> *)state,(dtime_tz_t *)(uVar12 * 8 + lVar8),
                       (AggregateUnaryInput *)local_78);
            uVar12 = local_78._16_8_ + 1;
            local_78._16_8_ = uVar12;
          }
        }
        else {
          uVar2 = *(ulong *)(lVar1 + uVar11 * 8);
          uVar13 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar13 = count;
          }
          if (uVar2 == 0xffffffffffffffff) goto joined_r0x003fc768;
          uVar9 = uVar13;
          uVar5 = uVar13;
          uVar6 = uVar13;
          uVar7 = uVar10;
          uVar4 = local_78._16_8_;
          if (uVar2 != 0) {
            while (local_78._16_8_ = uVar7, uVar9 = local_78._16_8_, uVar5 = uVar12, uVar6 = uVar4,
                  (ulong)local_78._16_8_ < uVar13) {
              if ((uVar2 >> ((ulong)(uint)((int)local_78._16_8_ - (int)uVar10) & 0x3f) & 1) != 0) {
                lVar1 = local_78._16_8_ * 8;
                local_78._16_8_ = uVar4;
                TimeTZAverageOperation::
                Operation<duckdb::dtime_tz_t,duckdb::AvgState<duckdb::hugeint_t>,duckdb::TimeTZAverageOperation>
                          ((AvgState<duckdb::hugeint_t> *)state,(dtime_tz_t *)(lVar1 + lVar8),
                           (AggregateUnaryInput *)local_78);
              }
              uVar12 = local_78._16_8_ + 1;
              uVar4 = uVar12;
              uVar7 = uVar12;
            }
          }
        }
        local_78._16_8_ = uVar6;
        uVar12 = uVar5;
        uVar11 = uVar11 + 1;
        uVar10 = uVar9;
      } while (uVar11 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      lVar8 = duckdb::Time::NormalizeTimeTZ((dtime_tz_t)**(uint64_t **)(input + 0x20));
      *(idx_t *)state = *(long *)state + count;
      AddToHugeint::AddConstant<duckdb::AvgState<duckdb::hugeint_t>,long>
                ((AvgState<duckdb::hugeint_t> *)state,lVar8,count);
      return;
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    local_90.input_mask = (ValidityMask *)(local_78 + 0x10);
    local_90.input = aggr_input_data;
    if (local_78._16_8_ == 0) {
      if (count != 0) {
        pFVar3 = ((optional_ptr<duckdb::FunctionData,_true> *)local_78._0_8_)->ptr;
        uVar12 = 0;
        do {
          local_90.input_idx = uVar12;
          if (pFVar3 != (FunctionData *)0x0) {
            local_90.input_idx = (idx_t)*(uint *)(pFVar3 + uVar12 * 4);
          }
          TimeTZAverageOperation::
          Operation<duckdb::dtime_tz_t,duckdb::AvgState<duckdb::hugeint_t>,duckdb::TimeTZAverageOperation>
                    ((AvgState<duckdb::hugeint_t> *)state,
                     (dtime_tz_t *)
                     (&((TemplatedValidityMask<unsigned_long> *)local_78._8_8_)->validity_mask +
                     local_90.input_idx),&local_90);
          uVar12 = uVar12 + 1;
        } while (count != uVar12);
      }
    }
    else if (count != 0) {
      pFVar3 = ((optional_ptr<duckdb::FunctionData,_true> *)local_78._0_8_)->ptr;
      uVar12 = 0;
      do {
        local_90.input_idx = uVar12;
        if (pFVar3 != (FunctionData *)0x0) {
          local_90.input_idx = (idx_t)*(uint *)(pFVar3 + uVar12 * 4);
        }
        if ((local_78._16_8_ == 0) ||
           ((*(ulong *)(local_78._16_8_ + (local_90.input_idx >> 6) * 8) >>
             (local_90.input_idx & 0x3f) & 1) != 0)) {
          TimeTZAverageOperation::
          Operation<duckdb::dtime_tz_t,duckdb::AvgState<duckdb::hugeint_t>,duckdb::TimeTZAverageOperation>
                    ((AvgState<duckdb::hugeint_t> *)state,
                     (dtime_tz_t *)
                     (&((TemplatedValidityMask<unsigned_long> *)local_78._8_8_)->validity_mask +
                     local_90.input_idx),&local_90);
        }
        uVar12 = uVar12 + 1;
      } while (count != uVar12);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}